

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlistmodel.cpp
# Opt level: O1

bool __thiscall
QStringListModel::setData(QStringListModel *this,QModelIndex *index,QVariant *value,int role)

{
  undefined1 *puVar1;
  bool bVar2;
  long i;
  long in_FS_OFFSET;
  QStringView rhs;
  QStringView lhs;
  QArrayData *d;
  QList<int> local_70;
  QString local_58;
  QArrayData *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = false;
  if ((((long)index->r < 0) || (bVar2 = false, (role & 0xfffffffdU) != 0)) ||
     (bVar2 = false, *(ulong *)(this + 0x20) <= (ulong)(long)index->r)) goto LAB_0049fdf9;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  ::QVariant::toString(&local_58,value);
  i = (long)index->r;
  puVar1 = *(undefined1 **)(*(long *)(this + 0x18) + 0x10 + i * 0x18);
  if (puVar1 == (undefined1 *)local_58.d.size) {
    rhs.m_data = local_58.d.ptr;
    rhs.m_size = local_58.d.size;
    lhs.m_data = *(storage_type_conflict **)(*(long *)(this + 0x18) + 8 + i * 0x18);
    lhs.m_size = (qsizetype)puVar1;
    bVar2 = QtPrivate::equalStrings(lhs,rhs);
    if (!bVar2) goto LAB_0049fd41;
  }
  else {
LAB_0049fd41:
    QList<QString>::replace((QList<QString> *)(this + 0x10),i,&local_58);
    local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    local_70.d.ptr = (int *)QArrayData::allocate(&local_38,4,0x10,2,KeepSize);
    local_70.d.d = (Data *)local_38;
    local_70.d.ptr[0] = 0;
    local_70.d.ptr[1] = 2;
    local_70.d.size = 2;
    QAbstractItemModel::dataChanged((QAbstractItemModel *)this,index,index,&local_70);
    if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,4,0x10);
      }
    }
  }
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  bVar2 = true;
LAB_0049fdf9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QStringListModel::setData(const QModelIndex &index, const QVariant &value, int role)
{
    if (index.row() >= 0 && index.row() < lst.size()
        && (role == Qt::EditRole || role == Qt::DisplayRole)) {
        const QString valueString = value.toString();
        if (lst.at(index.row()) == valueString)
            return true;
        lst.replace(index.row(), valueString);
        emit dataChanged(index, index, {Qt::DisplayRole, Qt::EditRole});
        return true;
    }
    return false;
}